

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-cave-util.c
# Opt level: O0

int borg_panel_wid(void)

{
  int local_10;
  int local_c;
  int panel_wid;
  
  if (Term == angband_term[0]) {
    local_c = ((Term->wid - col_map[Term->sidebar_mode]) + -1) / (int)(uint)tile_width;
  }
  else {
    local_c = Term->wid / (int)(uint)tile_width;
  }
  if (local_c < 1) {
    local_10 = 1;
  }
  else {
    local_10 = local_c;
  }
  return local_10;
}

Assistant:

int borg_panel_wid(void)
{
    int panel_wid;

    /* Use dimensions that match those in ui-output.c. */
    if (Term == term_screen) {
        panel_wid = SCREEN_WID;
    } else {
        panel_wid = Term->wid / tile_width;
    }
    /* Bound below to avoid division by zero. */
    return MAX(panel_wid, 1);
}